

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool __thiscall
libcellml::Units::UnitsImpl::performTestWithHistory
          (UnitsImpl *this,History *history,UnitsConstPtr *units,TestType type)

{
  EntityImpl *pEVar1;
  UnitsImpl *pUVar2;
  element_type *name;
  bool bVar3;
  ulong index;
  allocator<char> local_e1;
  History *local_e0;
  string reference;
  UnitsPtr childUnits;
  ModelPtr model;
  HistoryEpochPtr h;
  UnitsPtr importedUnits;
  ImportedEntity local_60;
  string local_50;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e0 = history;
  bVar3 = ImportedEntity::isImport(&this->mUnits->super_ImportedEntity);
  if (bVar3) {
    ImportedEntity::importSource((ImportedEntity *)&childUnits);
    ImportSource::model((ImportSource *)&reference);
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&reference);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reference._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&childUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    name = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
LAB_0020de47:
      bVar3 = false;
    }
    else {
      ImportedEntity::importReference_abi_cxx11_(&reference,&this->mUnits->super_ImportedEntity);
      Model::units((Model *)&importedUnits,(string *)name);
      std::__cxx11::string::~string((string *)&reference);
      if (importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        bVar3 = false;
      }
      else {
        ImportedEntity::importSource(&local_60);
        ImportSource::url_abi_cxx11_
                  ((string *)&childUnits,(ImportSource *)local_60._vptr_ImportedEntity);
        importeeModelUrl(&reference,local_e0,(string *)&childUnits);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_e1);
        createHistoryEpoch((libcellml *)&h,units,&reference,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&reference);
        std::__cxx11::string::~string((string *)&childUnits);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.mPimpl);
        bVar3 = checkForImportCycles(local_e0,&h);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          std::
          vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
          ::push_back(local_e0,&h);
          pUVar2 = (UnitsImpl *)
                   ((importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
          std::__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libcellml::Units,void>
                    ((__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2> *)&reference,
                     &importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                    );
          bVar3 = performTestWithHistory(pUVar2,local_e0,(UnitsConstPtr *)&reference,type);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reference._M_string_length);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else {
    ParentedEntity::parent((ParentedEntity *)&childUnits);
    std::dynamic_pointer_cast<libcellml::Model,libcellml::ParentedEntity>
              ((shared_ptr<libcellml::ParentedEntity> *)&reference);
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&reference);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reference._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&childUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    for (index = 0;
        pEVar1 = (this->mUnits->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
        index < (ulong)((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) -
                              pEVar1[2].mId.field_2._M_allocated_capacity) / 0x70);
        index = index + 1) {
      unitAttributeReference_abi_cxx11_(&reference,this->mUnits,index);
      bVar3 = isStandardUnitName(&reference);
      if (!bVar3) {
        if (model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (type != DEFINED) goto LAB_0020de1b;
        }
        else {
          Model::units((Model *)&childUnits,
                       (string *)
                       model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      );
          if (childUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (type != DEFINED) goto LAB_0020de11;
          }
          else {
            pUVar2 = (UnitsImpl *)
                     ((childUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
            std::__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<libcellml::Units,void>
                      ((__shared_ptr<libcellml::Units_const,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                       &childUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
            ;
            bVar3 = performTestWithHistory(pUVar2,local_e0,(UnitsConstPtr *)&local_50,type);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
            if (bVar3) {
LAB_0020de11:
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&childUnits.
                          super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              goto LAB_0020de1b;
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&childUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__cxx11::string::~string((string *)&reference);
        goto LAB_0020de47;
      }
LAB_0020de1b:
      std::__cxx11::string::~string((string *)&reference);
    }
    bVar3 = true;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar3;
}

Assistant:

bool Units::UnitsImpl::performTestWithHistory(History &history, const UnitsConstPtr &units, TestType type) const
{
    ModelPtr model;
    if (mUnits->isImport()) {
        model = mUnits->importSource()->model();
        if (model == nullptr) {
            return false;
        }

        auto importedUnits = model->units(mUnits->importReference());
        if (importedUnits == nullptr) {
            return false;
        }

        auto h = createHistoryEpoch(units, importeeModelUrl(history, mUnits->importSource()->url()));
        if (checkForImportCycles(history, h)) {
            return false;
        }

        history.push_back(h);

        return importedUnits->pFunc()->performTestWithHistory(history, importedUnits, type);
    }

    model = std::dynamic_pointer_cast<libcellml::Model>(mUnits->parent());
    for (size_t unitIndex = 0; unitIndex < mUnits->unitCount(); ++unitIndex) {
        std::string reference = mUnits->unitAttributeReference(unitIndex);
        if (isStandardUnitName(reference)) {
            continue;
        }

        if (model != nullptr) {
            auto childUnits = model->units(reference);
            if (childUnits != nullptr) {
                if (!childUnits->pFunc()->performTestWithHistory(history, childUnits, type)) {
                    return false;
                }
            } else if (type == TestType::DEFINED) {
                return false;
            }
        } else if (type == TestType::DEFINED) {
            return false;
        }
    }

    return true;
}